

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

hugeint_t __thiscall
duckdb::Hugeint::DivModPositive(Hugeint *this,hugeint_t lhs,uint64_t rhs,uint64_t *remainder)

{
  int iVar1;
  byte bVar2;
  ulong uVar4;
  ulong uVar5;
  Hugeint *pHVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Hugeint *pHVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  hugeint_t hVar14;
  char cVar3;
  
  uVar5 = lhs.upper;
  pHVar6 = (Hugeint *)lhs.lower;
  *(undefined8 *)rhs = 0;
  if (pHVar6 == (Hugeint *)0x0) {
    if (this == (Hugeint *)0x0) {
      bVar2 = 0;
      goto LAB_00dba508;
    }
    lVar8 = 0x3f;
    if (this != (Hugeint *)0x0) {
      for (; (ulong)this >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    bVar2 = (byte)lVar8;
    cVar3 = '@';
  }
  else {
    lVar8 = 0x3f;
    if (pHVar6 != (Hugeint *)0x0) {
      for (; (ulong)pHVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    bVar2 = (byte)lVar8;
    cVar3 = -0x80;
  }
  bVar2 = cVar3 - (bVar2 ^ 0x3f);
LAB_00dba508:
  if (bVar2 == 0) {
    uVar4 = 0;
    uVar7 = 0;
  }
  else {
    lVar8 = *(long *)rhs;
    uVar9 = (ulong)bVar2;
    uVar7 = 0;
    uVar4 = 0;
    do {
      uVar7 = uVar7 << 1 | uVar4 >> 0x3f;
      iVar1 = (int)uVar9;
      bVar13 = uVar9 < 0x41;
      uVar9 = uVar9 - 1;
      pHVar10 = pHVar6;
      if (bVar13) {
        pHVar10 = this;
      }
      uVar11 = (ulong)(iVar1 - 1U & 0xff);
      if (bVar13) {
        uVar11 = uVar9 & 0xffffffff;
      }
      uVar11 = (ulong)(((ulong)pHVar10 >> (uVar11 & 0x3f) & 1) != 0) + lVar8 * 2;
      uVar12 = 0;
      if (uVar5 <= uVar11) {
        uVar12 = uVar5;
      }
      lVar8 = uVar11 - uVar12;
      uVar4 = (ulong)(uVar5 <= uVar11) + uVar4 * 2;
    } while (uVar9 != 0);
    *(long *)rhs = lVar8;
  }
  hVar14.upper = uVar7;
  hVar14.lower = uVar4;
  return hVar14;
}

Assistant:

hugeint_t Hugeint::DivModPositive(hugeint_t lhs, uint64_t rhs, uint64_t &remainder) {
	D_ASSERT(lhs.upper >= 0);
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder <<= 1;
		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			// increment the remainder
			remainder++;
		}
		if (remainder >= rhs) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result.lower++;
			if (div_result.lower == 0) {
				// overflow
				div_result.upper++;
			}
		}
	}
	return div_result;
}